

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O1

SortNode * __thiscall GLDrawList::DoSort(GLDrawList *this,SortNode *head)

{
  GLDrawItemType GVar1;
  GLDrawItem *pGVar2;
  SortNode *pSVar3;
  SortNode *pSVar4;
  
  pGVar2 = (this->drawitems).Array;
  pSVar3 = head;
  do {
    pSVar4 = pSVar3;
    if (pSVar4->next == (SortNode *)0x0) break;
    pSVar3 = pSVar4->next;
  } while (pGVar2[pSVar4->itemindex].rendertype != GLDIT_FLAT);
  pSVar3 = (SortNode *)0x0;
  if (pGVar2[pSVar4->itemindex].rendertype == GLDIT_FLAT) {
    pSVar3 = pSVar4;
  }
  if (pSVar3 == (SortNode *)0x0) {
    pSVar3 = FindSortWall(this,head);
    if (pSVar3 == (SortNode *)0x0) {
      pSVar3 = SortSpriteList(this,head);
      return pSVar3;
    }
    if (pSVar3 == head) {
      head = head->next;
    }
    pSVar4 = pSVar3->parent;
    if (pSVar4 != (SortNode *)0x0) {
      pSVar4->next = pSVar3->next;
    }
    if (pSVar3->next != (SortNode *)0x0) {
      pSVar3->next->parent = pSVar4;
    }
    pSVar3->parent = (SortNode *)0x0;
    pSVar3->next = (SortNode *)0x0;
    while (pSVar4 = head, pSVar4 != (SortNode *)0x0) {
      head = pSVar4->next;
      GVar1 = (this->drawitems).Array[pSVar4->itemindex].rendertype;
      if (GVar1 == GLDIT_SPRITE) {
        SortSpriteIntoWall(this,pSVar3,pSVar4);
      }
      else if (GVar1 == GLDIT_WALL) {
        SortWallIntoWall(this,pSVar3,pSVar4);
      }
    }
  }
  else {
    if (pSVar3 == head) {
      head = head->next;
    }
    pSVar4 = pSVar3->parent;
    if (pSVar4 != (SortNode *)0x0) {
      pSVar4->next = pSVar3->next;
    }
    if (pSVar3->next != (SortNode *)0x0) {
      pSVar3->next->parent = pSVar4;
    }
    pSVar3->parent = (SortNode *)0x0;
    pSVar3->next = (SortNode *)0x0;
    while (pSVar4 = head, pSVar4 != (SortNode *)0x0) {
      head = pSVar4->next;
      GVar1 = (this->drawitems).Array[pSVar4->itemindex].rendertype;
      if (GVar1 == GLDIT_WALL) {
        SortWallIntoPlane(this,pSVar3,pSVar4);
      }
      else if (GVar1 == GLDIT_SPRITE) {
        SortSpriteIntoPlane(this,pSVar3,pSVar4);
      }
      else if (GVar1 == GLDIT_FLAT) {
        SortPlaneIntoPlane(this,pSVar3,pSVar4);
      }
    }
  }
  if (pSVar3->left != (SortNode *)0x0) {
    pSVar4 = DoSort(this,pSVar3->left);
    pSVar3->left = pSVar4;
  }
  if (pSVar3->right != (SortNode *)0x0) {
    pSVar4 = DoSort(this,pSVar3->right);
    pSVar3->right = pSVar4;
  }
  return pSVar3;
}

Assistant:

SortNode * GLDrawList::DoSort(SortNode * head)
{
	SortNode * node, * sn, * next;

	sn=FindSortPlane(head);
	if (sn)
	{
		if (sn==head) head=head->next;
		sn->UnlinkFromChain();
		node=head;
		head=sn;
		while (node)
		{
			next=node->next;
			switch(drawitems[node->itemindex].rendertype)
			{
			case GLDIT_FLAT:
				SortPlaneIntoPlane(head,node);
				break;

			case GLDIT_WALL:
				SortWallIntoPlane(head,node);
				break;

			case GLDIT_SPRITE:
				SortSpriteIntoPlane(head,node);
				break;
			}
			node=next;
		}
	}
	else
	{
		sn=FindSortWall(head);
		if (sn)
		{
			if (sn==head) head=head->next;
			sn->UnlinkFromChain();
			node=head;
			head=sn;
			while (node)
			{
				next=node->next;
				switch(drawitems[node->itemindex].rendertype)
				{
				case GLDIT_WALL:
					SortWallIntoWall(head,node);
					break;

				case GLDIT_SPRITE:
					SortSpriteIntoWall(head,node);
					break;

				case GLDIT_FLAT: break;
				}
				node=next;
			}
		}
		else 
		{
			return SortSpriteList(head);
		}
	}
	if (head->left) head->left=DoSort(head->left);
	if (head->right) head->right=DoSort(head->right);
	return sn;
}